

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::ES3>::
Run(CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  int i;
  GLuint GVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar5;
  long lVar6;
  size_type __n;
  CColorArray coords;
  TWrongStructure indirectElements2;
  CElementArray elements;
  CColorArray bufferTest;
  DrawArraysIndirectCommand indirectElements;
  CColorArray bufferRef;
  DIResult result;
  allocator_type local_539;
  string local_538;
  float local_518;
  undefined4 uStack_514;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_510;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4f8;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined8 uStack_4d0;
  value_type local_4c0;
  undefined1 local_4b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0 [23];
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [23];
  long local_1b0;
  DILogger local_1a8;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  local_4b0._0_8_ = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,0x1b3c1e9);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_330,(string *)local_4b0,
                     &local_538,true);
  this->_program = GVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._0_8_ != local_4a0) {
    operator_delete((void *)local_4b0._0_8_,local_4a0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_330._4_4_,local_330._0_4_) != local_320) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_330._4_4_,local_330._0_4_),
                    local_320[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar5 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_538._M_dataplus._M_p = (pointer)0x0;
    local_538._M_string_length = 0;
    local_538.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_538);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_538._M_string_length - (long)local_538._M_dataplus._M_p,
               local_538._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    uStack_4d0 = 0;
    __n = (long)(local_538._M_string_length - (long)local_538._M_dataplus._M_p) >> 4;
    _local_4d8 = CONCAT44(1,(int)__n);
    local_330._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_510,__n,(value_type_conflict4 *)local_330,(allocator_type *)local_4b0);
    if ((long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      lVar6 = 0;
      do {
        local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] = (uint)lVar6;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    buffers = &this->_bufferIndirect;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,&local_4d8,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,
               (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    local_330._0_4_ = local_330._0_4_ & 0xffffff00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_330 + 8));
    local_1b0 = 0;
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x502) {
      local_1b0 = -1;
      local_4b0._0_8_ = local_4b0._0_8_ & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_4b0,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
      DILogger::~DILogger((DILogger *)local_4b0);
    }
    _local_518 = CONCAT44(1,(float)(ulong)((long)(local_538._M_string_length -
                                                 (long)local_538._M_dataplus._M_p) >> 4));
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,8,&local_518,0x88e4);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x502) {
      local_1b0 = -1;
      local_4b0._0_8_ = local_4b0._0_8_ & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_4b0,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
      DILogger::~DILogger((DILogger *)local_4b0);
    }
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4b0,
               (long)(iVar3 * *(int *)(CONCAT44(extraout_var_00,iVar4) + 4)),
               (value_type *)&local_4f8,(allocator_type *)&local_4c0);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_02,iVar4) + 4);
    lVar5 = 0;
    do {
      local_4c0.m_data[lVar5] = 1.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4f8,(long)(iVar3 * iVar4),&local_4c0,&local_539);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_03,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,0,0,iVar3,*(int *)(CONCAT44(extraout_var_04,iVar4) + 4)
               ,local_4f8.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar3) + 4);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_4f8,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_4b0,widthRef,*(uint *)(CONCAT44(extraout_var_08,iVar3) + 4));
    DIResult::sub_result(&local_1a8,(DIResult *)local_330,lVar5);
    DILogger::~DILogger(&local_1a8);
    lVar5 = local_1b0;
    if (local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4f8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4f8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_4b0._0_8_,local_4a0[0]._M_allocated_capacity - local_4b0._0_8_);
    }
    DILogger::~DILogger((DILogger *)local_330);
    if (local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_510.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_510.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_538._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_538._M_dataplus._M_p,
                      local_538.field_2._M_allocated_capacity - (long)local_538._M_dataplus._M_p);
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand indirectElements = { 0, 0, 0, 0 };
		indirectElements.count					   = static_cast<GLuint>(coords.size());
		indirectElements.primCount				   = 1;

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		DIResult result;

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}

		TWrongStructure indirectElements2 = { 0, 0 };
		indirectElements2.count			  = static_cast<GLfloat>(coords.size());
		indirectElements2.primCount		  = 1;

		glDeleteBuffers(1, &_bufferIndirect);
		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(TWrongStructure), &indirectElements2, GL_STATIC_DRAW);

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}